

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O3

EStatusCode __thiscall
JPEGImageParser::SkipTillChar
          (JPEGImageParser *this,Byte inSkipUntilValue,unsigned_long *refSkipLimit)

{
  unsigned_long uVar1;
  int iVar2;
  undefined4 extraout_var;
  EStatusCode EVar3;
  
  EVar3 = eSuccess;
  if (*refSkipLimit != 0) {
    while (iVar2 = (*(this->mImageStream->super_IByteReader)._vptr_IByteReader[2])
                             (this->mImageStream,this->mReadBuffer,1),
          CONCAT44(extraout_var,iVar2) == 1) {
      uVar1 = *refSkipLimit;
      *refSkipLimit = uVar1 - 1;
      if (this->mReadBuffer[0] == inSkipUntilValue) {
        return eSuccess;
      }
      if (uVar1 - 1 == 0) {
        return eSuccess;
      }
    }
    EVar3 = eFailure;
  }
  return EVar3;
}

Assistant:

EStatusCode JPEGImageParser::SkipTillChar(IOBasicTypes::Byte inSkipUntilValue,unsigned long& refSkipLimit)
{
	EStatusCode status = PDFHummus::eSuccess;
	bool charNotFound = true;
	
	while(charNotFound && (PDFHummus::eSuccess == status) && (refSkipLimit > 0))
	{
		status = ReadStreamToBuffer(1);
		if(PDFHummus::eSuccess == status)
		{
			--refSkipLimit;
			if(mReadBuffer[0] == inSkipUntilValue)
				charNotFound = false;
		}
	}
	return status;
}